

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

int display_objects(nh_objitem *items,int icount,char *title,int how,nh_objresult *pick_list)

{
  uint n;
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  char *pcVar4;
  char buf [256];
  char local_138 [264];
  
  n = (*windowprocs.win_display_objects)(items,icount,title,how,pick_list);
  if (how - 1U < 0xfffffffe) {
    memcpy(local_138,"(none selected)",0x100);
    log_objmenu(n,pick_list);
    if (n == 1) {
      if (icount < 1) {
        uVar1 = 0;
      }
      else {
        piVar3 = &items->id;
        uVar2 = 0;
        do {
          uVar1 = uVar2;
          if (*piVar3 == pick_list->id) break;
          uVar2 = uVar2 + 1;
          piVar3 = piVar3 + 0x49;
          uVar1 = (ulong)(uint)icount;
        } while ((uint)icount != uVar2);
        uVar1 = uVar1 & 0xffffffff;
      }
      local_138[0] = items[uVar1].accel;
      local_138[1] = 0;
    }
    else if (1 < (int)n) {
      sprintf(local_138,"(%d selected)",(ulong)n);
    }
    pcVar4 = "List of objects";
    if (title != (char *)0x0) {
      pcVar4 = title;
    }
    pline("<%s: %s>",pcVar4,local_138);
    suppress_more();
  }
  return n;
}

Assistant:

int display_objects(struct nh_objitem *items, int icount, const char *title,
		    int how, struct nh_objresult *pick_list)
{
	int n, j;
	n = (*windowprocs.win_display_objects)(items, icount, title, how, pick_list);
	if (how != PICK_NONE && how != PICK_INVACTION) {
	    char buf[BUFSZ] = "(none selected)";
	    log_objmenu(n, pick_list);
	    if (n == 1) {
		for (j = 0; j < icount && items[j].id != pick_list[0].id; j++)
		    /* empty */;
		sprintf(buf, "%c", items[j].accel);
	    } else if (n > 1) {
		sprintf(buf, "(%d selected)", n);
	    }
	    pline("<%s: %s>", title ? title : "List of objects", buf);
	    suppress_more();
	}
	return n;
}